

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

void __thiscall
cpprofiler::Connector::start(Connector *this,string *file_path,int execution_id,bool has_restarts)

{
  ostream *poVar1;
  Connector *this_00;
  byte in_CL;
  int in_EDX;
  string *in_RSI;
  char *pcVar2;
  stringstream ss;
  string info;
  size_t pos;
  string base_name;
  string *info_00;
  string *this_01;
  string local_240;
  stringstream local_220 [16];
  ostream local_210 [383];
  allocator local_91;
  string local_90 [48];
  string local_60 [32];
  long local_40;
  string local_38 [35];
  byte local_15;
  int local_14;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  std::__cxx11::string::string(local_38,in_RSI);
  local_40 = std::__cxx11::string::find_last_of((char)local_38,0x2f);
  if (local_40 != -1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_38);
    std::__cxx11::string::operator=(local_38,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::stringstream::stringstream(local_220);
  std::operator<<(local_210,"{");
  poVar1 = std::operator<<(local_210,"\"has_restarts\": ");
  pcVar2 = "false";
  if ((local_15 & 1) != 0) {
    pcVar2 = "true";
  }
  this_00 = (Connector *)std::operator<<(poVar1,pcVar2);
  std::operator<<((ostream *)this_00,"\n");
  poVar1 = std::operator<<(local_210,",\"name\": ");
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\"");
  std::operator<<(poVar1,"\n");
  if (local_14 != -1) {
    poVar1 = std::operator<<(local_210,",\"execution_id\": ");
    std::ostream::operator<<(poVar1,local_14);
  }
  std::operator<<(local_210,"}");
  std::__cxx11::stringstream::str();
  this_01 = local_90;
  info_00 = &local_240;
  std::__cxx11::string::operator=(this_01,(string *)info_00);
  std::__cxx11::string::~string((string *)info_00);
  std::__cxx11::stringstream::~stringstream(local_220);
  MessageMarshalling::makeStart((MessageMarshalling *)this_01,info_00);
  sendOverSocket(this_00);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void start(const std::string& file_path = "",
               int execution_id = -1, bool has_restarts = false) {
    /// extract fzn file name
    std::string base_name(file_path);
    {
      size_t pos = base_name.find_last_of('/');
      if (pos != static_cast<size_t>(-1)) {
        base_name = base_name.substr(pos + 1, base_name.length() - pos - 1);
      }
    }

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"has_restarts\": " << (has_restarts ? "true" : "false")  << "\n";
      ss << ",\"name\": " << "\"" << base_name << "\"" << "\n";
      if (execution_id != -1) {
        ss << ",\"execution_id\": " << execution_id;
      }
      ss << "}";
      info = ss.str();
    }

    marshalling.makeStart(info);
    sendOverSocket();
  }